

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall jsonnet::internal::Allocator::~Allocator(Allocator *this)

{
  ASTs *this_00;
  u32string *this_01;
  _Base_ptr p_Var1;
  map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
  *__range2;
  _List_node_base *p_Var2;
  
  this_00 = &this->allocated;
  p_Var2 = (_List_node_base *)this_00;
  while (p_Var2 = (((_List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)this_00) {
    if (p_Var2[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)(*(long *)p_Var2[1]._M_next + 8))();
    }
  }
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::clear
            (this_00);
  for (p_Var1 = (this->internedIdentifiers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->internedIdentifiers)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    this_01 = *(u32string **)(p_Var1 + 2);
    if (this_01 != (u32string *)0x0) {
      std::__cxx11::u32string::~u32string(this_01);
    }
    operator_delete(this_01,0x20);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
           *)this);
  std::__cxx11::_List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::
  _M_clear(&this_00->
            super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
               *)this);
  return;
}

Assistant:

~Allocator()
    {
        for (auto x : allocated) {
            delete x;
        }
        allocated.clear();
        for (const auto &x : internedIdentifiers) {
            delete x.second;
        }
        internedIdentifiers.clear();
    }